

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O3

ON_RenderContent * __thiscall
ON_RenderContentPrivate::FindChild(ON_RenderContentPrivate *this,wchar_t *child_slot_name)

{
  bool bVar1;
  int iVar2;
  ON_RenderContent *pOVar3;
  ON_wString local_30;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  pOVar3 = this->m_first_child;
  if (pOVar3 != (ON_RenderContent *)0x0) {
    do {
      (*(pOVar3->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x3b])(&local_30,pOVar3);
      bVar1 = ::operator==(&local_30,child_slot_name);
      ON_wString::~ON_wString(&local_30);
      if (bVar1) goto LAB_00598eb3;
      pOVar3 = pOVar3->_private->m_next_sibling;
    } while (pOVar3 != (ON_RenderContent *)0x0);
  }
  pOVar3 = (ON_RenderContent *)0x0;
LAB_00598eb3:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  return pOVar3;
}

Assistant:

ON_RenderContent* ON_RenderContentPrivate::FindChild(const wchar_t* child_slot_name) const
{
  std::lock_guard<std::recursive_mutex> lg(m_mutex);

  ON_RenderContent* child_rc = m_first_child;
  while (nullptr != child_rc)
  {
    if (child_rc->ChildSlotName() == child_slot_name)
      return child_rc;

    child_rc = child_rc->_private->m_next_sibling;
  }

  return nullptr;
}